

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

ssize_t xar_write_data(archive_write *a,void *buff,size_t s)

{
  void *buff_00;
  long *plVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  _func_int_archive_sha1_ctx_ptr_void_ptr_size_t **pp_Var6;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **pp_Var7;
  la_int64_t lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  size_t sVar17;
  uchar *b;
  _func_int_archive_md5_ctx_ptr_void_ptr_size_t **local_48;
  
  pvVar2 = a->format_data;
  uVar3 = *(ulong *)((long)pvVar2 + 0x48);
  sVar12 = s;
  if (uVar3 < s) {
    sVar12 = uVar3;
  }
  if ((sVar12 == 0) || (*(long *)((long)pvVar2 + 0x40) == 0)) {
    return 0;
  }
  if (*(int *)(*(long *)((long)pvVar2 + 0x40) + 0xf8) != 0) {
    *(void **)((long)pvVar2 + 200) = buff;
    *(size_t *)((long)pvVar2 + 0xd0) = sVar12;
    buff_00 = (void *)((long)pvVar2 + 0x120);
    sVar17 = 0;
    local_48 = &__archive_digest.md5update;
    while( true ) {
      uVar4 = 0;
      if ((*(int *)((long)pvVar2 + 0xf8) != 0) &&
         (uVar4 = (**(code **)((long)pvVar2 + 0x108))(a,(long)pvVar2 + 200,s < uVar3), 1 < uVar4)) {
        return -0x1e;
      }
      if (s < uVar3 && *(long *)((long)pvVar2 + 0xe8) != 0) break;
      sVar17 = 0x10000 - *(long *)((long)pvVar2 + 0xe8);
      iVar5 = *(int *)((long)pvVar2 + 0x98);
      if (iVar5 == 1) {
        lVar14 = 0x10;
        pp_Var6 = &__archive_digest.sha1update;
LAB_0015d540:
        (**pp_Var6)((archive_md5_ctx *)(lVar14 + (long)pvVar2 + 0x98),buff_00,sVar17);
      }
      else if (iVar5 == 2) {
        lVar14 = 8;
        pp_Var6 = (_func_int_archive_sha1_ctx_ptr_void_ptr_size_t **)local_48;
        goto LAB_0015d540;
      }
      plVar1 = (long *)(*(long *)((long)pvVar2 + 0x40) + 0xe8);
      *plVar1 = *plVar1 + sVar17;
      iVar5 = write_to_temp(a,buff_00,sVar17);
      if (iVar5 != 0) {
        return -0x1e;
      }
      if (uVar4 != 0) break;
      *(void **)((long)pvVar2 + 0xe0) = buff_00;
      *(undefined8 *)((long)pvVar2 + 0xe8) = 0x10000;
    }
    sVar12 = sVar12 - *(long *)((long)pvVar2 + 0xd0);
    if (*(int *)((long)pvVar2 + 0xb0) == 1) {
      pp_Var7 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
      lVar14 = 0x10;
    }
    else {
      if (*(int *)((long)pvVar2 + 0xb0) != 2) goto LAB_0015d66a;
      pp_Var7 = &__archive_digest.md5update;
      lVar14 = 8;
    }
    (**pp_Var7)((archive_md5_ctx *)((long)pvVar2 + lVar14 + 0xb0),buff,sVar12);
    goto LAB_0015d66a;
  }
  if (*(int *)((long)pvVar2 + 0xb0) == 1) {
    pp_Var7 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
    lVar14 = 0x10;
LAB_0015d5f9:
    (**pp_Var7)((archive_md5_ctx *)((long)pvVar2 + lVar14 + 0xb0),buff,sVar12);
  }
  else if (*(int *)((long)pvVar2 + 0xb0) == 2) {
    pp_Var7 = &__archive_digest.md5update;
    lVar14 = 8;
    goto LAB_0015d5f9;
  }
  sVar17 = sVar12;
  if (*(int *)((long)pvVar2 + 0x98) == 1) {
    pp_Var7 = (_func_int_archive_md5_ctx_ptr_void_ptr_size_t **)&__archive_digest.sha1update;
    lVar14 = 0x10;
  }
  else {
    if (*(int *)((long)pvVar2 + 0x98) != 2) goto LAB_0015d66a;
    pp_Var7 = &__archive_digest.md5update;
    lVar14 = 8;
  }
  (**pp_Var7)((archive_md5_ctx *)((long)pvVar2 + lVar14 + 0x98),buff,sVar12);
LAB_0015d66a:
  lVar14 = *(long *)((long)pvVar2 + 0x48);
  lVar8 = archive_entry_size(*(archive_entry **)(*(long *)((long)pvVar2 + 0x40) + 0x20));
  lVar15 = *(long *)((long)pvVar2 + 0x40);
  if ((((lVar14 == lVar8) && (*(undefined8 *)(lVar15 + 0x158) = 0, 2 < sVar12)) && (*buff == '#'))
     && (*(char *)((long)buff + 1) == '!')) {
    uVar9 = (ulong)(*(char *)((long)buff + 2) == ' ');
    uVar3 = uVar9 + 2;
    uVar16 = sVar12 - uVar3;
    uVar9 = uVar9 | 0x1002;
    if (uVar16 < 0x1001) {
      uVar9 = sVar12;
    }
    uVar11 = 3;
    if (uVar3 < uVar9) {
      uVar10 = uVar3;
      uVar13 = 0x1000;
      if (uVar16 < 0x1000) {
        uVar13 = uVar16;
      }
      do {
        if (((ulong)*(byte *)((long)buff + uVar10) < 0x21) &&
           (uVar11 = uVar10,
           (0x100002601U >> ((ulong)*(byte *)((long)buff + uVar10) & 0x3f) & 1) != 0)) break;
        uVar13 = uVar13 - 1;
        uVar11 = uVar9;
        uVar10 = uVar10 + 1;
      } while (uVar13 != 0);
    }
    archive_strncat((archive_string *)(lVar15 + 0x150),(void *)((long)buff + uVar3),uVar11 - uVar3);
    lVar15 = *(long *)((long)pvVar2 + 0x40);
  }
  if (*(int *)(lVar15 + 0xf8) == 0) {
    iVar5 = write_to_temp(a,buff,sVar17);
    if (iVar5 != 0) {
      return -0x1e;
    }
    plVar1 = (long *)(*(long *)((long)pvVar2 + 0x40) + 0xe8);
    *plVar1 = *plVar1 + sVar17;
  }
  *(long *)((long)pvVar2 + 0x48) = *(long *)((long)pvVar2 + 0x48) - sVar12;
  return sVar12;
}

Assistant:

static ssize_t
xar_write_data(struct archive_write *a, const void *buff, size_t s)
{
	struct xar *xar;
	enum la_zaction run;
	size_t size = 0;
	size_t rsize;
	int r;

	xar = (struct xar *)a->format_data;

	if (s > xar->bytes_remaining)
		s = (size_t)xar->bytes_remaining;
	if (s == 0 || xar->cur_file == NULL)
		return (0);
	if (xar->cur_file->data.compression == NONE) {
		checksum_update(&(xar->e_sumwrk), buff, s);
		checksum_update(&(xar->a_sumwrk), buff, s);
		size = rsize = s;
	} else {
		xar->stream.next_in = (const unsigned char *)buff;
		xar->stream.avail_in = s;
		if (xar->bytes_remaining > s)
			run = ARCHIVE_Z_RUN;
		else
			run = ARCHIVE_Z_FINISH;
		/* Compress file data. */
		for (;;) {
			r = compression_code(&(a->archive), &(xar->stream),
			    run);
			if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
				return (ARCHIVE_FATAL);
			if (xar->stream.avail_out == 0 ||
			    run == ARCHIVE_Z_FINISH) {
				size = sizeof(xar->wbuff) -
				    xar->stream.avail_out;
				checksum_update(&(xar->a_sumwrk), xar->wbuff,
				    size);
				xar->cur_file->data.length += size;
				if (write_to_temp(a, xar->wbuff,
				    size) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
				if (r == ARCHIVE_OK) {
					/* Output buffer was full */
					xar->stream.next_out = xar->wbuff;
					xar->stream.avail_out =
					    sizeof(xar->wbuff);
				} else {
					/* ARCHIVE_EOF - We are done */
					break;
				}
			} else {
				/* Compressor wants more input */
				break;
			}
		}
		rsize = s - xar->stream.avail_in;
		checksum_update(&(xar->e_sumwrk), buff, rsize);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	if (xar->bytes_remaining ==
	    (uint64_t)archive_entry_size(xar->cur_file->entry)) {
		/*
		 * Get the path of a shell script if so.
		 */
		const unsigned char *b = (const unsigned char *)buff;

		archive_string_empty(&(xar->cur_file->script));
		if (rsize > 2 && b[0] == '#' && b[1] == '!') {
			size_t i, end, off;

			off = 2;
			if (b[off] == ' ')
				off++;
#ifdef PATH_MAX
			if ((rsize - off) > PATH_MAX)
				end = off + PATH_MAX;
			else
#endif
				end = rsize;
			/* Find the end of a script path. */
			for (i = off; i < end && b[i] != '\0' &&
			    b[i] != '\n' && b[i] != '\r' &&
			    b[i] != ' ' && b[i] != '\t'; i++)
				;
			archive_strncpy(&(xar->cur_file->script), b + off,
			    i - off);
		}
	}
#endif

	if (xar->cur_file->data.compression == NONE) {
		if (write_to_temp(a, buff, size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		xar->cur_file->data.length += size;
	}
	xar->bytes_remaining -= rsize;

	return (rsize);
}